

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O0

void __thiscall Kernel::KBO::State::traverse<_1,true>(State *this,KBO *kbo,AppliedTerm tt)

{
  AppliedTerm parent;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  int iVar4;
  uint uVar5;
  Term *pTVar6;
  undefined8 in_RDI;
  AppliedTerm t;
  State *curr;
  TermList *in_stack_ffffffffffffff10;
  TermList *this_00;
  size_t in_stack_ffffffffffffff18;
  State *in_stack_ffffffffffffff20;
  State *this_01;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar7;
  TermList t_00;
  TermList in_stack_ffffffffffffff40;
  Stack<State> *in_stack_ffffffffffffff48;
  SubstApplicator *in_stack_ffffffffffffff50;
  uint uStack_a4;
  TermList local_80;
  Stack<State> *local_78;
  SubstApplicator *local_70;
  State local_68;
  State *local_48;
  uint64_t local_40;
  Stack<State> *local_38;
  uint64_t local_30;
  undefined4 local_28;
  uint uStack_24;
  
  t_00._content = (uint64_t)&stack0x00000008;
  bVar3 = TermList::isVar(in_stack_ffffffffffffff10);
  if (bVar3) {
    TermList::var((TermList *)t_00._content);
    recordVariable<_1>(in_stack_ffffffffffffff20,(uint)(in_stack_ffffffffffffff18 >> 0x20));
  }
  else {
    if ((traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState == '\0') &&
       (iVar4 = __cxa_guard_acquire(&traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::
                                     recState), iVar4 != 0)) {
      Lib::Stack<State>::Stack((Stack<State> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      __cxa_atexit(Lib::Stack<State>::~Stack,&traverse<-1,_true>::recState,&__dso_handle);
      __cxa_guard_release(&traverse<-1,true>(Kernel::KBO_const&,Kernel::AppliedTerm)::recState);
    }
    local_40 = ((TermList *)t_00._content)->_content;
    local_38 = (Stack<State> *)((TermList *)(t_00._content + 8))->_content;
    local_30 = ((TermList *)(t_00._content + 0x10))->_content;
    local_28 = 0;
    this_01 = (State *)((ulong)uStack_24 << 0x20);
    auVar1._4_4_ = in_stack_ffffffffffffff28;
    auVar1._0_4_ = uStack_24;
    auVar1._8_4_ = in_stack_ffffffffffffff2c;
    auVar1._12_8_ = t_00._content;
    auVar1._20_8_ = in_RDI;
    auVar1._28_4_ = 0;
    Lib::Stack<State>::push(local_38,(State)(auVar1 << 0x20));
    while (bVar3 = Lib::Stack<State>::isNonEmpty(&traverse<-1,_true>::recState), bVar3) {
      local_48 = Lib::Stack<State>::top(&traverse<-1,_true>::recState);
      uVar7 = local_48->arg;
      pTVar6 = TermList::term((TermList *)0x888eea);
      uVar5 = Term::arity(pTVar6);
      if (uVar7 < uVar5) {
        pTVar6 = TermList::term((TermList *)0x888f44);
        uVar5 = local_48->arg;
        local_48->arg = uVar5 + 1;
        Term::nthArgument(pTVar6,uVar5);
        this_00 = *(TermList **)&(local_48->t).aboveVar;
        uVar5 = (uint)((ulong)(local_48->t).applicator >> 0x20);
        parent._8_8_ = in_stack_ffffffffffffff48;
        parent.term._content = in_stack_ffffffffffffff40._content;
        parent.applicator = in_stack_ffffffffffffff50;
        AppliedTerm::AppliedTerm
                  ((AppliedTerm *)CONCAT44(uVar7,in_stack_ffffffffffffff28),t_00,parent);
        bVar3 = TermList::isVar(this_00);
        if (bVar3) {
          TermList::var(&local_80);
          recordVariable<_1>(this_01,uVar5);
        }
        else {
          TermList::term((TermList *)0x888feb);
          bVar3 = Term::ground((Term *)0x888ff3);
          if (!bVar3) {
            this_01 = (State *)((ulong)uStack_a4 << 0x20);
            auVar2._4_4_ = in_stack_ffffffffffffff28;
            auVar2._0_4_ = uStack_a4;
            auVar2._8_4_ = uVar7;
            auVar2._12_8_ = t_00._content;
            auVar2._20_8_ = in_RDI;
            auVar2._28_4_ = 0;
            in_stack_ffffffffffffff40._content = local_80._content;
            in_stack_ffffffffffffff48 = local_78;
            in_stack_ffffffffffffff50 = local_70;
            Lib::Stack<State>::push(local_78,(State)(auVar2 << 0x20));
          }
        }
      }
      else {
        Lib::Stack<State>::pop(&local_68,&traverse<-1,_true>::recState);
      }
    }
  }
  return;
}

Assistant:

void KBO::State::traverse(KBO const& kbo, AppliedTerm tt)
{
  static_assert(coef==1 || coef==-1);

  if (tt.term.isVar()) {
    if constexpr (!varsOnly) {
      _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
    }
    recordVariable<coef>(tt.term.var());
    return;
  }
  struct State {
    AppliedTerm t;
    unsigned arg;
  };
  static Stack<State> recState;
  recState.push(State{ tt, 0 });

  if constexpr (!varsOnly) {
    _weightDiff += kbo.symbolWeight(tt.term.term()) * coef;
  }

  while (recState.isNonEmpty()) {
    auto& curr = recState.top();
    if (curr.arg >= curr.t.term.term()->arity()) {
      recState.pop();
      continue;
    }
    AppliedTerm t(*curr.t.term.term()->nthArgument(curr.arg++), curr.t);
    if (t.term.isVar()) {
      ASS(!t.aboveVar);
      if constexpr (!varsOnly) {
        _weightDiff += kbo._funcWeights._specialWeights._variableWeight * coef;
      }
      recordVariable<coef>(t.term.var());
      continue;
    }

    if constexpr (varsOnly) {
      if (!t.term.term()->ground()) {
        recState.push(State{ t, 0 });
      }
    } else {
      _weightDiff += kbo.symbolWeight(t.term.term()) * coef;
      recState.push(State{ t, 0 });
    }
  }
}